

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O2

void __thiscall Kernel::Clause::destroy(Clause *this)

{
  Inference *this_00;
  bool bVar1;
  int iVar2;
  anon_union_8_2_756040a0_for_Iterator_0 in_RAX;
  Clause *this_01;
  Iterator it;
  
  it.field_0 = in_RAX;
  if ((destroy()::toDestroy == '\0') &&
     (iVar2 = __cxa_guard_acquire(&destroy()::toDestroy), iVar2 != 0)) {
    Lib::Stack<Kernel::Clause_*>::Stack(&destroy::toDestroy,0x20);
    __cxa_atexit(Lib::Stack<Kernel::Clause_*>::~Stack,&destroy::toDestroy,&__dso_handle);
    __cxa_guard_release(&destroy()::toDestroy);
  }
  while( true ) {
    if (*(int *)(Lib::env + 0x85a8) == 2) {
      Lib::ProofExtra::remove((ProofExtra *)&DAT_00a141b8,(char *)this);
    }
    this_00 = &(this->super_Unit)._inference;
    it = Inference::iterator(this_00);
    while (bVar1 = Inference::hasNext(this_00,&it), bVar1) {
      this_01 = (Clause *)Inference::next(this_00,&it);
      if (((this_01->super_Unit).field_0x4 & 1) == 0) {
        this_01->_refCnt = this_01->_refCnt - 1;
        bVar1 = shouldBeDestroyed(this_01);
        if (bVar1) {
          Lib::Stack<Kernel::Clause_*>::push(&destroy::toDestroy,this_01);
        }
      }
    }
    Inference::destroyDirectlyOwned(this_00);
    destroyExceptInferenceObject(this);
    if (destroy::toDestroy._cursor == destroy::toDestroy._stack) break;
    this = destroy::toDestroy._cursor[-1];
    destroy::toDestroy._cursor = destroy::toDestroy._cursor + -1;
  }
  return;
}

Assistant:

void Clause::destroy()
{
  static Stack<Clause*> toDestroy(32);
  Clause* cl = this;
  for(;;) {
    if (env.options->proofExtra() == Options::ProofExtra::FULL) {
      env.proofExtra.remove(cl);
    }
    Inference::Iterator it = cl->_inference.iterator();
    while (cl->_inference.hasNext(it)) {
      Unit* refU = cl->_inference.next(it);
      if (!refU->isClause()) {
        continue;
      }
      Clause* refCl = static_cast<Clause*> (refU);
      refCl->_refCnt--;
      if (refCl->shouldBeDestroyed()) {
        toDestroy.push(refCl);
      }
    }
    cl->_inference.destroyDirectlyOwned();
    cl->destroyExceptInferenceObject();
    if (toDestroy.isEmpty()) {
      break;
    }
    cl = toDestroy.pop();
  }
}